

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O2

bool __thiscall
QObject::disconnect<void(QPlatformSystemTrayIcon::*)(QPoint,QPlatformScreen_const*)>
          (QObject *this,Object *sender,offset_in_QPlatformSystemTrayIcon_to_subr signal,
          QObject *receiver,void **zero)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  Object *local_18;
  offset_in_QPlatformSystemTrayIcon_to_subr local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = sender;
  local_10 = signal;
  uVar1 = QObject::disconnectImpl
                    (this,&local_18,receiver,zero,
                     (QMetaObject *)&QPlatformSystemTrayIcon::staticMetaObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool disconnect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                  const QObject *receiver, void **zero)
    {
        // This is the overload for when one wish to disconnect a signal from any slot. (slot=nullptr)
        // Since the function template parameter cannot be deduced from '0', we use a
        // dummy void ** parameter that must be equal to 0
        Q_ASSERT(!zero);
        typedef QtPrivate::FunctionPointer<Func1> SignalType;
        return disconnectImpl(sender, reinterpret_cast<void **>(&signal), receiver, zero,
                              &SignalType::Object::staticMetaObject);
    }